

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::handleBashArguments(QPDFArgParser *this)

{
  byte bVar1;
  element_type *peVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  pointer psVar6;
  pointer pcVar7;
  reference pvVar8;
  bool bVar9;
  pointer psVar10;
  size_type sVar11;
  size_t i;
  pointer pcVar12;
  allocator<char> local_99;
  shared_ptr<const_char> local_98;
  string local_88;
  string arg;
  pointer local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar12 = (peVar2->bash_line)._M_dataplus._M_p;
  sVar3 = (peVar2->bash_line)._M_string_length;
  sVar11 = 0;
  iVar5 = 0;
  bVar9 = false;
  do {
    if (sVar3 == sVar11) {
      peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      psVar6 = (peVar2->bash_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar10 = *(pointer *)
                 ((long)&(peVar2->bash_argv).
                         super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (psVar6 == psVar10) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,*peVar2->argv,&local_99);
        QUtil::make_shared_cstr((QUtil *)&local_48,&local_88);
        local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
        local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             a_Stack_40[0]._M_pi;
        local_48 = (pointer)0x0;
        a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
        emplace_back<std::shared_ptr<char_const>>
                  ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                    *)&peVar2->bash_argv,&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
        std::__cxx11::string::~string((string *)&local_88);
        peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        psVar6 = (peVar2->bash_argv).
                 super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar10 = *(pointer *)
                   ((long)&(peVar2->bash_argv).
                           super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                           ._M_impl.super__Vector_impl_data + 8);
      }
      QUtil::make_shared_array<char_const*>
                ((QUtil *)&local_88,((long)psVar10 - (long)psVar6 >> 4) + 1);
      std::__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->bash_argv_ph).
                  super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
      pcVar12 = (pointer)0x0;
      while( true ) {
        peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pcVar7 = (pointer)((long)*(pointer *)
                                  ((long)&(peVar2->bash_argv).
                                          super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(peVar2->bash_argv).
                                 super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
        if (pcVar7 <= pcVar12) break;
        pvVar8 = std::
                 vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                 ::at(&peVar2->bash_argv,(size_type)pcVar12);
        (((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        [(long)pcVar12] =
             (pvVar8->super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pcVar12 = pcVar12 + 1;
      }
      local_88._M_dataplus._M_p = pcVar7;
      iVar5 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                        ((unsigned_long *)&local_88);
      peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar2->argc = iVar5;
      (peVar2->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [peVar2->argc] = (element_type)0x0;
      peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar2->argv = (peVar2->bash_argv_ph).
                     super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::~string((string *)&arg);
      return;
    }
    bVar1 = pcVar12[sVar11];
    if (bVar9) {
      std::__cxx11::string::append((ulong)&arg,'\x01');
LAB_0014f740:
      bVar9 = false;
      iVar4 = iVar5;
    }
    else {
      bVar9 = true;
      iVar4 = iVar5;
      if (bVar1 != 0x5c) {
        if (iVar5 == 2) {
          bVar9 = false;
          iVar4 = 0;
          if (bVar1 != 0x22) {
LAB_0014f77a:
            std::__cxx11::string::append((ulong)&arg,'\x01');
            goto LAB_0014f740;
          }
        }
        else if (iVar5 == 1) {
          bVar9 = false;
          iVar4 = 0;
          if (bVar1 != 0x27) goto LAB_0014f77a;
        }
        else if (bVar1 - 9 < 5) {
LAB_0014f792:
          if (arg._M_string_length != 0) {
            peVar2 = (this->m).
                     super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            QUtil::make_shared_cstr((QUtil *)&local_98,&arg);
            local_88._M_dataplus._M_p =
                 local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_88._M_string_length =
                 (size_type)
                 local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pointer)0x0;
            local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
            emplace_back<std::shared_ptr<char_const>>
                      ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                        *)&peVar2->bash_argv,(shared_ptr<const_char> *)&local_88);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            arg._M_string_length = 0;
            *arg._M_dataplus._M_p = '\0';
          }
          bVar9 = false;
          iVar4 = 0;
        }
        else {
          if (bVar1 == 0x27) {
            iVar4 = 1;
          }
          else {
            if (bVar1 != 0x22) {
              if (bVar1 != 0x20) goto LAB_0014f77a;
              goto LAB_0014f792;
            }
            iVar4 = 2;
          }
          bVar9 = false;
        }
      }
    }
    iVar5 = iVar4;
    sVar11 = sVar11 + 1;
  } while( true );
}

Assistant:

void
QPDFArgParser::handleBashArguments()
{
    // Do a minimal job of parsing bash_line into arguments. This doesn't do everything the shell
    // does (e.g. $(...), variable expansion, arithmetic, globs, etc.), but it should be good enough
    // for purposes of handling completion. As we build up the new argv, we can't use m->new_argv
    // because this code has to interoperate with @file arguments, so memory for both ways of
    // fabricating argv has to be protected.

    bool last_was_backslash = false;
    enum { st_top, st_squote, st_dquote } state = st_top;
    std::string arg;
    for (char ch: m->bash_line) {
        if (last_was_backslash) {
            arg.append(1, ch);
            last_was_backslash = false;
        } else if (ch == '\\') {
            last_was_backslash = true;
        } else {
            bool append = false;
            switch (state) {
            case st_top:
                if (util::is_space(ch)) {
                    if (!arg.empty()) {
                        m->bash_argv.push_back(QUtil::make_shared_cstr(arg));
                        arg.clear();
                    }
                } else if (ch == '"') {
                    state = st_dquote;
                } else if (ch == '\'') {
                    state = st_squote;
                } else {
                    append = true;
                }
                break;

            case st_squote:
                if (ch == '\'') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;

            case st_dquote:
                if (ch == '"') {
                    state = st_top;
                } else {
                    append = true;
                }
                break;
            }
            if (append) {
                arg.append(1, ch);
            }
        }
    }
    if (m->bash_argv.empty()) {
        // This can't happen if properly invoked by bash, but ensure we have a valid argv[0]
        // regardless.
        m->bash_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    }
    // Explicitly discard any non-space-terminated word. The "current word" is handled specially.
    m->bash_argv_ph = QUtil::make_shared_array<char const*>(1 + m->bash_argv.size());
    for (size_t i = 0; i < m->bash_argv.size(); ++i) {
        m->bash_argv_ph.get()[i] = m->bash_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->bash_argv.size());
    m->bash_argv_ph.get()[m->argc] = nullptr;
    m->argv = m->bash_argv_ph.get();
}